

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col)

{
  bool bVar1;
  void **ppvVar2;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ImDrawList *in_RSI;
  ImDrawList *in_RDI;
  ImVec2 *in_R8;
  ImVec2 *in_R9;
  uint in_stack_00000008;
  bool push_texture_id;
  ImTextureID in_stack_ffffffffffffffa8;
  ImDrawList *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int idx_count;
  char cVar3;
  undefined4 in_stack_ffffffffffffffcc;
  uint col_00;
  ImDrawList *this_00;
  
  if ((in_stack_00000008 & 0xff000000) != 0) {
    bVar1 = ImVector<void_*>::empty(&in_RDI->_TextureIdStack);
    idx_count = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
    this_00 = in_RSI;
    if (!bVar1) {
      ppvVar2 = ImVector<void_*>::back((ImVector<void_*> *)in_RSI);
      idx_count = CONCAT13(in_RSI != (ImDrawList *)*ppvVar2,(int3)idx_count);
      in_stack_ffffffffffffffb0 = in_RSI;
    }
    cVar3 = (char)((uint)idx_count >> 0x18);
    col_00 = CONCAT13(cVar3,(int3)in_stack_ffffffffffffffcc);
    if (cVar3 != '\0') {
      PushTextureID(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    PrimReserve(in_RDI,idx_count,in_stack_ffffffffffffffb8);
    PrimRectUV(this_00,in_RDX,in_RCX,in_R8,in_R9,col_00);
    if ((col_00 & 0x1000000) != 0) {
      PopTextureID(in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(p_min, p_max, uv_min, uv_max, col);

    if (push_texture_id)
        PopTextureID();
}